

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> __thiscall
wabt::MakeUnique<wabt::GlobalModuleField,wabt::Location>(wabt *this,Location *args)

{
  Location *loc;
  GlobalModuleField *this_00;
  string_view local_28;
  Location *local_18;
  Location *args_local;
  
  local_18 = args;
  args_local = (Location *)this;
  this_00 = (GlobalModuleField *)operator_new(0x80);
  loc = local_18;
  string_view::string_view(&local_28);
  GlobalModuleField::GlobalModuleField(this_00,loc,local_28);
  std::unique_ptr<wabt::GlobalModuleField,std::default_delete<wabt::GlobalModuleField>>::
  unique_ptr<std::default_delete<wabt::GlobalModuleField>,void>
            ((unique_ptr<wabt::GlobalModuleField,std::default_delete<wabt::GlobalModuleField>> *)
             this,this_00);
  return (__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}